

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O0

void __thiscall QSizeGrip::mousePressEvent(QSizeGrip *this,QMouseEvent *e)

{
  QRect QVar1;
  Representation RVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  MouseButton MVar6;
  uint uVar7;
  ScrollBarPolicy SVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  QSizeGripPrivate *this_00;
  QWidget *this_01;
  QRect *pQVar13;
  QWindow *pQVar14;
  long *plVar15;
  QPlatformTheme *pQVar16;
  int *piVar17;
  QSinglePointEvent *in_RSI;
  long in_FS_OFFSET;
  bool bVar18;
  int leftRightDecoration;
  int bottomDecoration;
  int titleBarHeight;
  QAbstractScrollArea *scrollArea;
  QWidget *tlwParent;
  bool hasHorizontalSizeConstraint;
  bool hasVerticalSizeConstraint;
  QPlatformWindow *platformWindow;
  QWidget *tlw;
  QSizeGripPrivate *d;
  QRect frameGeometry;
  QRect availableGeometry;
  Edges edges;
  undefined4 in_stack_fffffffffffffec8;
  WindowType in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  WidgetAttribute in_stack_fffffffffffffed4;
  Corner in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  bool local_111;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QWidget *in_stack_ffffffffffffff08;
  int local_b8;
  int local_b4 [3];
  int local_a8;
  int local_a4;
  undefined1 local_a0 [16];
  QRect local_90;
  QRect local_80;
  QRect local_70;
  undefined1 local_60 [16];
  QFlagsStorageHelper<Qt::Edge,_4> local_50;
  Int local_4c;
  QFlagsStorageHelper<Qt::WindowType,_4> local_48;
  QFlagsStorageHelper<Qt::WindowType,_4> local_44;
  QPointF local_40;
  QPoint local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MVar6 = QSinglePointEvent::button(in_RSI);
  if (MVar6 == LeftButton) {
    this_00 = d_func((QSizeGrip *)0x6803fd);
    this_01 = qt_sizegrip_topLevelWidget
                        ((QWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    local_40 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x68041b);
    local_30 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    *(QPoint *)&(this_00->super_QWidgetPrivate).field_0x254 = local_30;
    this_00->gotMousePress = true;
    pQVar13 = QWidget::geometry(this_01);
    RVar2.m_i = (pQVar13->y1).m_i;
    (this_00->r).x1 = (Representation)(pQVar13->x1).m_i;
    (this_00->r).y1 = (Representation)RVar2.m_i;
    RVar2.m_i = (pQVar13->y2).m_i;
    (this_00->r).x2 = (Representation)(pQVar13->x2).m_i;
    (this_00->r).y2 = (Representation)RVar2.m_i;
    this_00->m_platformSizeGrip = false;
    bVar3 = QWidget::isWindow((QWidget *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    local_111 = false;
    if (bVar3) {
      pQVar14 = QWidget::windowHandle
                          ((QWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0))
      ;
      local_111 = false;
      if (pQVar14 != (QWindow *)0x0) {
        local_48.super_QFlagsStorage<Qt::WindowType>.i =
             (QFlagsStorage<Qt::WindowType>)
             QWidget::windowFlags
                       ((QWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        local_44.super_QFlagsStorage<Qt::WindowType>.i =
             (QFlagsStorage<Qt::WindowType>)
             QFlags<Qt::WindowType>::operator&
                       ((QFlags<Qt::WindowType> *)
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffecc);
        bVar3 = QFlags<Qt::WindowType>::operator!((QFlags<Qt::WindowType> *)&local_44);
        local_111 = false;
        if (bVar3) {
          bVar3 = QWidget::testAttribute
                            ((QWidget *)
                             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                             in_stack_fffffffffffffed4);
          local_111 = false;
          if (!bVar3) {
            uVar7 = (**(code **)(*(long *)this_01 + 0x88))();
            local_111 = false;
            if ((uVar7 & 1) == 0) {
              local_111 = usePlatformSizeGrip((QWidget *)
                                              CONCAT44(in_stack_fffffffffffffefc,
                                                       in_stack_fffffffffffffef8));
            }
          }
        }
      }
    }
    if (local_111 != false) {
      QWidget::windowHandle
                ((QWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      plVar15 = (long *)QWindow::handle();
      local_4c = 0xaaaaaaaa;
      local_50.super_QFlagsStorage<Qt::Edge>.i =
           (QFlagsStorage<Qt::Edge>)edgesFromCorner(in_stack_fffffffffffffed8);
      local_4c = (Int)local_50.super_QFlagsStorage<Qt::Edge>.i;
      bVar5 = (**(code **)(*plVar15 + 0x138))(plVar15,local_50.super_QFlagsStorage<Qt::Edge>.i);
      this_00->m_platformSizeGrip = (bool)(bVar5 & 1);
    }
    QVar1.x2.m_i = local_70.x2.m_i;
    QVar1.y2.m_i = local_70.y2.m_i;
    QVar1.x1.m_i = local_70.x1.m_i;
    QVar1.y1.m_i = local_70.y1.m_i;
    if ((this_00->m_platformSizeGrip & 1U) == 0) {
      local_60._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      bVar3 = true;
      bVar18 = true;
      bVar4 = QWidget::isWindow((QWidget *)
                                CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      if (bVar4) {
        pQVar16 = QGuiApplicationPrivate::platformTheme();
        (**(code **)(*(long *)pQVar16 + 0x60))(&local_28,pQVar16,0x25);
        bVar5 = ::QVariant::toBool();
        ::QVariant::~QVariant(&local_28);
        if ((bVar5 & 1) == 0) {
          local_80 = QWidgetPrivate::availableScreenGeometry
                               ((QWidget *)
                                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
          local_60 = (undefined1  [16])local_80;
        }
        else {
          QWidget::screen((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          local_60 = QScreen::availableVirtualGeometry();
          local_70 = (QRect)local_60;
        }
      }
      else {
        QWidget::parentWidget((QWidget *)0x6806fc);
        QWidget::parentWidget((QWidget *)0x68070b);
        in_stack_ffffffffffffff08 =
             (QWidget *)qobject_cast<QAbstractScrollArea*>((QObject *)0x680713);
        if (in_stack_ffffffffffffff08 != (QWidget *)0x0) {
          SVar8 = QAbstractScrollArea::horizontalScrollBarPolicy
                            ((QAbstractScrollArea *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          bVar18 = SVar8 == ScrollBarAlwaysOff;
          SVar8 = QAbstractScrollArea::verticalScrollBarPolicy
                            ((QAbstractScrollArea *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          bVar3 = SVar8 == ScrollBarAlwaysOff;
        }
        local_90 = QWidget::contentsRect
                             ((QWidget *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        local_60 = (undefined1  [16])local_90;
      }
      local_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = (undefined1  [16])QWidget::frameGeometry(in_stack_ffffffffffffff08);
      QWidget::geometry(this_01);
      iVar9 = QRect::y((QRect *)0x6807d0);
      local_a4 = QRect::y((QRect *)0x6807e1);
      local_a4 = iVar9 - local_a4;
      local_a8 = 0;
      piVar17 = qMax<int>(&local_a4,&local_a8);
      iVar9 = *piVar17;
      iVar10 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
      ;
      iVar11 = QWidget::height((QWidget *)0x680831);
      local_b4[2] = (iVar10 - iVar11) - iVar9;
      local_b4[1] = 0;
      piVar17 = qMax<int>(local_b4 + 2,local_b4 + 1);
      iVar10 = *piVar17;
      iVar11 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      iVar12 = QWidget::width((QWidget *)0x680885);
      local_b4[0] = (iVar11 - iVar12) / 2;
      local_b8 = 0;
      piVar17 = qMax<int>(local_b4,&local_b8);
      iVar11 = *piVar17;
      bVar4 = QSizeGripPrivate::atBottom(this_00);
      if (bVar4) {
        if (bVar3) {
          iVar9 = QRect::bottom((QRect *)0x6808e6);
          iVar12 = QRect::bottom((QRect *)0x6808fb);
          this_00->dyMax = (iVar9 - iVar12) - iVar10;
        }
        else {
          this_00->dyMax = 0x7fffffff;
        }
      }
      else if (bVar3) {
        iVar10 = QRect::y((QRect *)0x680937);
        iVar12 = QRect::y((QRect *)0x68094c);
        this_00->dyMax = (iVar10 - iVar12) + iVar9;
      }
      else {
        this_00->dyMax = -0x7fffffff;
      }
      bVar3 = QSizeGripPrivate::atLeft(this_00);
      QVar1 = local_70;
      if (bVar3) {
        if (bVar18) {
          iVar9 = QRect::x((QRect *)0x680998);
          iVar10 = QRect::x((QRect *)0x6809ad);
          this_00->dxMax = (iVar9 - iVar10) + iVar11;
          QVar1 = local_70;
        }
        else {
          this_00->dxMax = -0x7fffffff;
        }
      }
      else if (bVar18) {
        iVar9 = QRect::right((QRect *)0x6809e9);
        iVar10 = QRect::right((QRect *)0x6809fe);
        this_00->dxMax = (iVar9 - iVar10) - iVar11;
        QVar1 = local_70;
      }
      else {
        this_00->dxMax = 0x7fffffff;
      }
    }
  }
  else {
    QWidget::mousePressEvent
              ((QWidget *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (QMouseEvent *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QVar1.x2.m_i = local_70.x2.m_i;
    QVar1.y2.m_i = local_70.y2.m_i;
    QVar1.x1.m_i = local_70.x1.m_i;
    QVar1.y1.m_i = local_70.y1.m_i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    local_70 = QVar1;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSizeGrip::mousePressEvent(QMouseEvent * e)
{
    if (e->button() != Qt::LeftButton) {
        QWidget::mousePressEvent(e);
        return;
    }

    Q_D(QSizeGrip);
    QWidget *tlw = qt_sizegrip_topLevelWidget(this);
    d->p = e->globalPosition().toPoint();
    d->gotMousePress = true;
    d->r = tlw->geometry();

    // Does the platform provide size grip support?
    d->m_platformSizeGrip = false;
    if (tlw->isWindow()
        && tlw->windowHandle()
        && !(tlw->windowFlags() & Qt::X11BypassWindowManagerHint)
        && !tlw->testAttribute(Qt::WA_DontShowOnScreen)
        && !tlw->hasHeightForWidth()
        && usePlatformSizeGrip(tlw)) {
        QPlatformWindow *platformWindow = tlw->windowHandle()->handle();
        const Qt::Edges edges = edgesFromCorner(d->m_corner);
        d->m_platformSizeGrip = platformWindow->startSystemResize(edges);
    }

    if (d->m_platformSizeGrip)
        return;

    // Find available desktop/workspace geometry.
    QRect availableGeometry;
    bool hasVerticalSizeConstraint = true;
    bool hasHorizontalSizeConstraint = true;
    if (tlw->isWindow()) {
        if (QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::InteractiveResizeAcrossScreens).toBool())
            availableGeometry = tlw->screen()->availableVirtualGeometry();
        else
            availableGeometry = QWidgetPrivate::availableScreenGeometry(tlw);
    }
    else {
        const QWidget *tlwParent = tlw->parentWidget();
        // Check if tlw is inside QAbstractScrollArea/QScrollArea.
        // If that's the case tlw->parentWidget() will return the viewport
        // and tlw->parentWidget()->parentWidget() will return the scroll area.
#if QT_CONFIG(scrollarea)
        QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(tlwParent->parentWidget());
        if (scrollArea) {
            hasHorizontalSizeConstraint = scrollArea->horizontalScrollBarPolicy() == Qt::ScrollBarAlwaysOff;
            hasVerticalSizeConstraint = scrollArea->verticalScrollBarPolicy() == Qt::ScrollBarAlwaysOff;
        }
#endif // QT_CONFIG(scrollarea)
        availableGeometry = tlwParent->contentsRect();
    }

    // Find frame geometries, title bar height, and decoration sizes.
    const QRect frameGeometry = tlw->frameGeometry();
    const int titleBarHeight = qMax(tlw->geometry().y() - frameGeometry.y(), 0);
    const int bottomDecoration = qMax(frameGeometry.height() - tlw->height() - titleBarHeight, 0);
    const int leftRightDecoration = qMax((frameGeometry.width() - tlw->width()) / 2, 0);

    // Determine dyMax depending on whether the sizegrip is at the bottom
    // of the widget or not.
    if (d->atBottom()) {
        if (hasVerticalSizeConstraint)
            d->dyMax = availableGeometry.bottom() - d->r.bottom() - bottomDecoration;
        else
            d->dyMax = INT_MAX;
    } else {
        if (hasVerticalSizeConstraint)
            d->dyMax = availableGeometry.y() - d->r.y() + titleBarHeight;
        else
            d->dyMax = -INT_MAX;
    }

    // In RTL mode, the size grip is to the left; find dxMax from the desktop/workspace
    // geometry, the size grip geometry and the width of the decoration.
    if (d->atLeft()) {
        if (hasHorizontalSizeConstraint)
            d->dxMax = availableGeometry.x() - d->r.x() + leftRightDecoration;
        else
            d->dxMax = -INT_MAX;
    } else {
        if (hasHorizontalSizeConstraint)
            d->dxMax = availableGeometry.right() - d->r.right() - leftRightDecoration;
        else
            d->dxMax = INT_MAX;
    }
}